

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_char>,signed_char,duckdb::BitOrOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  byte bVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar4 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar2 = *(long *)(input + 0x28);
      uVar6 = 0;
      uVar11 = 0;
      do {
        if (lVar2 == 0) {
          uVar7 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar7 = count;
          }
LAB_004a3e95:
          uVar8 = uVar11;
          if (uVar11 < uVar7) {
            bVar5 = *state;
            bVar10 = state[1];
            do {
              bVar1 = *(byte *)(lVar4 + uVar11);
              if ((bVar5 & 1) == 0) {
                *state = '\x01';
                bVar5 = 1;
                bVar10 = bVar1;
              }
              else {
                bVar10 = bVar10 | bVar1;
              }
              uVar11 = uVar11 + 1;
            } while (uVar7 != uVar11);
            state[1] = bVar10;
            uVar8 = uVar7;
          }
        }
        else {
          uVar3 = *(ulong *)(lVar2 + uVar6 * 8);
          uVar7 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar7 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_004a3e95;
          uVar8 = uVar7;
          if ((uVar3 != 0) && (uVar8 = uVar11, uVar11 < uVar7)) {
            uVar13 = 0;
            do {
              if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
                bVar5 = *(byte *)(uVar11 + lVar4 + uVar13);
                if (*state == '\0') {
                  state[1] = bVar5;
                  *state = '\x01';
                }
                else {
                  state[1] = state[1] | bVar5;
                }
              }
              uVar13 = uVar13 + 1;
              uVar8 = uVar7;
            } while (uVar7 - uVar11 != uVar13);
          }
        }
        uVar6 = uVar6 + 1;
        uVar11 = uVar8;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      bVar5 = **(byte **)(input + 0x20);
      if (*state == '\0') {
        *state = '\x01';
      }
      else {
        bVar5 = bVar5 | state[1];
      }
      state[1] = bVar5;
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        lVar4 = *local_68;
        bVar5 = *state;
        bVar10 = state[1];
        iVar9 = 0;
        do {
          iVar12 = iVar9;
          if (lVar4 != 0) {
            iVar12 = (idx_t)*(uint *)(lVar4 + iVar9 * 4);
          }
          bVar1 = *(byte *)(local_60 + iVar12);
          if ((bVar5 & 1) == 0) {
            *state = '\x01';
            bVar5 = 1;
            bVar10 = bVar1;
          }
          else {
            bVar10 = bVar10 | bVar1;
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
        state[1] = bVar10;
      }
    }
    else if (count != 0) {
      lVar4 = *local_68;
      iVar9 = 0;
      do {
        iVar12 = iVar9;
        if (lVar4 != 0) {
          iVar12 = (idx_t)*(uint *)(lVar4 + iVar9 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar12 >> 6) * 8) >> (iVar12 & 0x3f) & 1) != 0) {
          if (*state == '\0') {
            state[1] = *(byte *)(local_60 + iVar12);
            *state = '\x01';
          }
          else {
            state[1] = state[1] | *(byte *)(local_60 + iVar12);
          }
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}